

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLattice.cpp
# Opt level: O2

void __thiscall OpenMD::shapedLattice::findSites(shapedLattice *this)

{
  uint uVar1;
  pointer pVVar2;
  int iVar3;
  int ny;
  ulong uVar4;
  int nz;
  int nx;
  long lVar5;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> pointsOrt;
  Vector3d myOrt;
  Vector3d myPoint;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_b8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_a0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_98;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  pVVar2 = (this->sites_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->sites_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  pVVar2 = (this->orientations_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->orientations_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->orientations_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)&local_90
             ,&this->simpleLattice_->cellSitesOrt);
  local_98 = &this->sites_;
  local_a0 = &this->orientations_;
  uVar1 = this->simpleLattice_->nCellSites;
  nx = this->beginNx_;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  for (; nx <= this->endNx_; nx = nx + 1) {
    for (ny = this->beginNy_; ny <= this->endNy_; ny = ny + 1) {
      for (nz = this->beginNz_; nz <= this->endNz_; nz = nz + 1) {
        Lattice::getLatticePointsPos
                  (this->simpleLattice_,
                   (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   &local_b8,nx,ny,nz);
        for (lVar5 = 0; uVar4 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
          Vector<double,_3U>::Vector
                    (&local_48,
                     (Vector<double,_3U> *)
                     ((long)((local_b8._M_impl.super__Vector_impl_data._M_start)->
                            super_Vector<double,_3U>).data_ + lVar5));
          iVar3 = (*this->_vptr_shapedLattice[2])(this,&local_48);
          if ((char)iVar3 != '\0') {
            Vector<double,_3U>::Vector
                      (&local_60,
                       (Vector<double,_3U> *)
                       ((long)((local_b8._M_impl.super__Vector_impl_data._M_start)->
                              super_Vector<double,_3U>).data_ + lVar5));
            Vector<double,_3U>::Vector
                      (&local_78,
                       (Vector<double,_3U> *)
                       ((long)((local_90._M_impl.super__Vector_impl_data._M_start)->
                              super_Vector<double,_3U>).data_ + lVar5));
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back(local_98,(value_type *)&local_60);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back(local_a0,(value_type *)&local_78);
          }
        }
      }
    }
  }
  this->sitesComputed_ = true;
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&local_90);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&local_b8);
  return;
}

Assistant:

void shapedLattice::findSites() {
    sites_.clear();
    orientations_.clear();

    std::vector<Vector3d> latticePos;
    std::vector<Vector3d> pointsOrt = simpleLattice_->getLatticePointsOrt();
    int numMolPerCell               = simpleLattice_->getNumSitesPerCell();

    for (int i = beginNx_; i <= endNx_; i++) {
      for (int j = beginNy_; j <= endNy_; j++) {
        for (int k = beginNz_; k <= endNz_; k++) {
          // get the position of the cell sites
          simpleLattice_->getLatticePointsPos(latticePos, i, j, k);
          for (int l = 0; l < numMolPerCell; l++) {
            if (isInterior(latticePos[l])) {
              Vector3d myPoint = latticePos[l];
              Vector3d myOrt   = pointsOrt[l];
              sites_.push_back(myPoint);
              orientations_.push_back(myOrt);
            }
          }
        }
      }
    }
    sitesComputed_ = true;
  }